

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O0

void __thiscall
google::
sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
::move_from(sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
            *this,MoveDontCopyT mover,
           sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           *ht,size_type min_buckets_wanted)

{
  bool bVar1;
  sparsetable<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *psVar2;
  size_type i;
  size_type sVar3;
  ulong uVar4;
  int in_ESI;
  sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4> *in_RDI;
  size_type bucknum;
  size_type num_probes;
  destructive_iterator it;
  size_type resize_to;
  iterator *in_stack_fffffffffffffef8;
  sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_ffffffffffffff00;
  ulong in_stack_ffffffffffffff08;
  sparsetable<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  size_type in_stack_ffffffffffffff38;
  sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4> *in_stack_ffffffffffffff40;
  long lVar5;
  sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_ffffffffffffff90;
  size_type in_stack_ffffffffffffffc8;
  sparsetable<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_ffffffffffffffd0;
  sparsetable<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *local_28
  ;
  
  clear(in_stack_ffffffffffffff00);
  if (in_ESI == 1) {
    local_28 = (sparsetable<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)bucket_count((sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                                *)0xa2596f);
  }
  else {
    size(in_stack_ffffffffffffff00);
    local_28 = (sparsetable<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)sparsehash_internal::
                  sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>::min_buckets
                            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                             CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  }
  psVar2 = (sparsetable<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
            *)bucket_count((sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                            *)0xa259ba);
  if (psVar2 < local_28) {
    sparsetable<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::resize
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    bucket_count((sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)0xa259e7);
    sparsehash_internal::sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>::
    reset_thresholds((sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4> *)
                     in_stack_ffffffffffffff00,(size_type)in_stack_fffffffffffffef8);
  }
  destructive_begin(in_stack_ffffffffffffff90);
  while( true ) {
    destructive_end(in_stack_ffffffffffffff90);
    bVar1 = sparse_hashtable_destructive_iterator<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
            ::operator!=((sparse_hashtable_destructive_iterator<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                          *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    if (!bVar1) break;
    lVar5 = 0;
    sparse_hashtable_destructive_iterator<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::operator*((sparse_hashtable_destructive_iterator<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                 *)0xa25a4c);
    get_key(in_stack_ffffffffffffff00,(const_reference)in_stack_fffffffffffffef8);
    i = hash<int>(in_stack_ffffffffffffff00,(int *)in_stack_fffffffffffffef8);
    sVar3 = bucket_count((sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                          *)0xa25a7b);
    uVar4 = i & sVar3 - 1;
    while( true ) {
      bVar1 = sparsetable<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::test(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      if (!bVar1) break;
      lVar5 = lVar5 + 1;
      in_stack_ffffffffffffff10 =
           (sparsetable<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
            *)(uVar4 + lVar5);
      sVar3 = bucket_count((sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                            *)0xa25acf);
      uVar4 = (ulong)in_stack_ffffffffffffff10 & sVar3 - 1;
    }
    in_stack_ffffffffffffff00 =
         (sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          *)&in_RDI[1].shrink_threshold_;
    sparse_hashtable_destructive_iterator<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::operator*((sparse_hashtable_destructive_iterator<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                 *)0xa25b0a);
    sparsetable<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::set
              (local_28,i,(const_reference)in_stack_ffffffffffffff10);
    sparse_hashtable_destructive_iterator<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::operator++((sparse_hashtable_destructive_iterator<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)in_stack_ffffffffffffff00);
    in_stack_ffffffffffffff08 = uVar4;
  }
  sparsehash_internal::sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>::
  inc_num_ht_copies(in_RDI);
  return;
}

Assistant:

void move_from(MoveDontCopyT mover, sparse_hashtable& ht,
                 size_type min_buckets_wanted) {
    clear();  // clear table, set num_deleted to 0

    // If we need to change the size of our table, do it now
    size_type resize_to;
    if (mover == MoveDontGrow)
      resize_to = ht.bucket_count();  // keep same size as old ht
    else                              // MoveDontCopy
      resize_to = settings.min_buckets(ht.size(), min_buckets_wanted);
    if (resize_to > bucket_count()) {  // we don't have enough buckets
      table.resize(resize_to);         // sets the number of buckets
      settings.reset_thresholds(bucket_count());
    }

    // We use a normal iterator to get non-deleted bcks from ht
    // We could use insert() here, but since we know there are
    // no duplicates and no deleted items, we can be more efficient
    assert((bucket_count() & (bucket_count() - 1)) == 0);  // a power of two
    // THIS IS THE MAJOR LINE THAT DIFFERS FROM COPY_FROM():
    for (destructive_iterator it = ht.destructive_begin();
         it != ht.destructive_end(); ++it) {
      size_type num_probes = 0;  // how many times we've probed
      size_type bucknum;
      for (bucknum = hash(get_key(*it)) & (bucket_count() - 1);  // h % buck_cnt
           table.test(bucknum);                                  // not empty
           bucknum =
               (bucknum + JUMP_(key, num_probes)) & (bucket_count() - 1)) {
        ++num_probes;
        assert(num_probes < bucket_count() &&
               "Hashtable is full: an error in key_equal<> or hash<>");
      }
      table.set(bucknum, *it);  // copies the value to here
    }
    settings.inc_num_ht_copies();
  }